

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars,
          bool writeZeroObjective)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  Item *pIVar2;
  uint *puVar3;
  undefined8 *puVar4;
  pointer pnVar5;
  Item *pIVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  SPxOut *pSVar8;
  Real eps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  value2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  value2_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  value2_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  value2_02;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  value2_03;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  value2_04;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  value2_05;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  value2_06;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  value2_07;
  bool bVar9;
  type_conflict5 tVar10;
  int iVar11;
  int iVar12;
  ostream *poVar13;
  double *pdVar14;
  char *pcVar15;
  undefined8 extraout_RAX;
  ostream *poVar16;
  SPxInternalCodeException *this_00;
  int iVar17;
  ulong uVar18;
  byte bVar19;
  long lVar20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *value1;
  cpp_dec_float<50U,_int,_void> *pcVar21;
  undefined7 in_register_00000089;
  long lVar22;
  long lVar23;
  long lVar24;
  char *pcVar25;
  cpp_dec_float<50U,_int,_void> *pcVar26;
  undefined7 in_stack_fffffffffffff6b0;
  byte in_stack_fffffffffffff6b7;
  undefined8 in_stack_fffffffffffff6c8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar27;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar28;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *p_lp;
  NameSet *pNVar29;
  NameSet *pNVar30;
  undefined1 in_stack_fffffffffffff6d8;
  undefined7 in_stack_fffffffffffff6d9;
  int local_91c;
  Verbosity old_verbosity;
  uint uStack_914;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_908;
  uint local_8f8 [2];
  int local_8f0;
  bool local_8ec;
  fpclass_type local_8e8;
  int32_t iStack_8e4;
  ulong local_8d8;
  ulong local_8d0;
  char name1 [16];
  double local_8b0;
  undefined4 local_8a8;
  int local_8a4;
  long local_8a0;
  undefined1 local_898 [16];
  size_type local_888;
  uint auStack_880 [2];
  uint local_878 [2];
  int local_870;
  bool local_86c;
  fpclass_type local_868;
  int32_t iStack_864;
  Tolerances *local_860;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_858;
  size_type local_850;
  uint auStack_848 [2];
  uint local_840 [2];
  int local_838;
  bool local_834;
  fpclass_type local_830;
  int32_t iStack_82c;
  char name [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_7b8;
  cpp_dec_float<50U,_int,_void> local_778;
  cpp_dec_float<50U,_int,_void> local_738;
  cpp_dec_float<50U,_int,_void> local_6f8;
  Tolerances *local_6b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6b0;
  size_type local_6a8;
  uint auStack_6a0 [2];
  uint local_698 [2];
  int local_690;
  bool local_68c;
  fpclass_type local_688;
  int32_t iStack_684;
  Tolerances *local_678;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_670;
  size_type local_668;
  uint auStack_660 [2];
  uint local_658 [2];
  int local_650;
  bool local_64c;
  fpclass_type local_648;
  int32_t iStack_644;
  Tolerances *local_638;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_630;
  size_type local_628;
  uint auStack_620 [2];
  uint local_618 [2];
  int local_610;
  bool local_60c;
  fpclass_type local_608;
  int32_t iStack_604;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5f8;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined4 local_590;
  undefined1 local_58c;
  undefined8 local_588;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_578;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined4 local_510;
  undefined1 local_50c;
  undefined8 local_508;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined4 local_450;
  undefined1 local_44c;
  undefined8 local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  char name2 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_3b0;
  cpp_dec_float<50U,_int,_void> local_378;
  cpp_dec_float<50U,_int,_void> local_340;
  cpp_dec_float<50U,_int,_void> local_308;
  cpp_dec_float<50U,_int,_void> local_2d0;
  cpp_dec_float<50U,_int,_void> local_298;
  cpp_dec_float<50U,_int,_void> local_260;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1f0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_8a8 = (undefined4)CONCAT71(in_register_00000089,writeZeroObjective);
  lVar20 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar20 + -0x18) + 8) = 0x10;
  lVar20 = *(long *)(lVar20 + -0x18);
  *(uint *)(p_output + lVar20 + 0x18) = *(uint *)(p_output + lVar20 + 0x18) & 0xfffffefb | 0x100;
  poVar13 = std::operator<<(p_output,"NAME          MPSDATA");
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<(p_output,"ROWS");
  std::endl<char,std::char_traits<char>>(poVar13);
  lVar24 = 0;
  lVar20 = 0;
  uVar18 = 0;
  do {
    if ((this->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum <= lVar20) {
      local_8d8 = uVar18;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_a0,0.0,(type *)0x0);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_d8,0.0,(type *)0x0);
      value2_00.m_backend.data._M_elems._8_7_ = in_stack_fffffffffffff6b0;
      value2_00.m_backend.data._M_elems._0_8_ = &local_d8;
      value2_00.m_backend.data._M_elems[3]._3_1_ = in_stack_fffffffffffff6b7;
      value2_00.m_backend.data._M_elems._16_8_ = p_output;
      value2_00.m_backend.data._M_elems._24_8_ = p_cnames;
      value2_00.m_backend.data._M_elems[8] = (int)in_stack_fffffffffffff6c8;
      value2_00.m_backend.data._M_elems[9] = (int)((ulong)in_stack_fffffffffffff6c8 >> 0x20);
      value2_00.m_backend._40_8_ = p_rnames;
      value2_00.m_backend.fpclass._0_1_ = in_stack_fffffffffffff6d8;
      value2_00.m_backend._49_7_ = in_stack_fffffffffffff6d9;
      poVar13 = p_output;
      MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (p_output,"N","MINIMIZE",(char *)0x0,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_a0,(char *)0x0,value2_00);
      poVar16 = std::operator<<(p_output,"COLUMNS");
      std::endl<char,std::char_traits<char>>(poVar16);
      if (p_intvars == (DIdxSet *)0x0) {
        local_91c = 1;
        local_8d0 = 0;
      }
      else {
        bVar9 = 0 < (p_intvars->super_IdxSet).num;
        local_8d0 = (ulong)bVar9;
        local_91c = bVar9 + 1;
      }
      psVar1 = &this->_tolerances;
      pSVar27 = this;
      for (iVar12 = 0; iVar12 != local_91c; iVar12 = iVar12 + 1) {
        in_stack_fffffffffffff6b7 = iVar12 == 1 & (byte)local_8d0;
        if (in_stack_fffffffffffff6b7 == 1) {
          poVar16 = std::operator<<(poVar13,"    MARK0001  \'MARKER\'                 \'INTORG\'");
          std::endl<char,std::char_traits<char>>(poVar16);
        }
        for (lVar20 = 0;
            lVar20 < (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum; lVar20 = lVar20 + 1) {
          if (((byte)local_8d0 == '\0') ||
             (iVar11 = IdxSet::pos(&p_intvars->super_IdxSet,(int)lVar20),
             -1 < iVar11 == (bool)in_stack_fffffffffffff6b7)) {
            pIVar6 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            iVar11 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[lVar20].idx;
            pIVar2 = pIVar6 + iVar11;
            local_8a4 = (pIVar6[iVar11].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused / 2) * 2;
            lVar24 = (long)local_8a4;
            lVar23 = 0;
            pNVar30 = p_rnames;
            local_8a0 = lVar20;
            for (lVar22 = 0; lVar20 = local_8a0, iVar11 = (int)local_8a0, lVar22 < lVar24;
                lVar22 = lVar22 + 2) {
              pSVar28 = pSVar27;
              pcVar25 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (pSVar27,iVar11,p_cnames,name);
              in_stack_fffffffffffff6d8 = SUB81(pcVar25,0);
              in_stack_fffffffffffff6d9 = (undefined7)((ulong)pcVar25 >> 8);
              pNVar29 = pNVar30;
              pcVar25 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (pSVar27,*(int *)((long)(&((pIVar2->data).
                                                                                                                          
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar23),pNVar30,name1);
              pNVar7 = (pIVar2->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              puVar3 = (uint *)((long)(pNVar7->val).m_backend.data._M_elems + lVar23);
              local_438.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar3;
              local_438.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
              puVar3 = (uint *)((long)(pNVar7->val).m_backend.data._M_elems + lVar23 + 0x10);
              local_438.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
              local_438.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
              local_438.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar23 + 0x20);
              local_438.m_backend.exp = *(int *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar23)
              ;
              local_438.m_backend.neg =
                   *(bool *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar23 + 4);
              local_438.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar23 + 8);
              pcVar15 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (pSVar27,*(int *)((long)(&(pIVar2->data).
                                                                                                                        
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem[1].val + 1) + lVar23),pNVar30,name2);
              pNVar7 = (pIVar2->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              puVar4 = (undefined8 *)((long)pNVar7[1].val.m_backend.data._M_elems + lVar23);
              local_478 = *puVar4;
              uStack_470 = puVar4[1];
              puVar4 = (undefined8 *)((long)pNVar7[1].val.m_backend.data._M_elems + lVar23 + 0x10);
              local_468 = *puVar4;
              uStack_460 = puVar4[1];
              local_458 = *(undefined8 *)
                           ((long)pNVar7[1].val.m_backend.data._M_elems + lVar23 + 0x20);
              local_450 = *(undefined4 *)((long)(&pNVar7[1].val.m_backend.data + 1) + lVar23);
              local_44c = *(undefined1 *)((long)(&pNVar7[1].val.m_backend.data + 1) + lVar23 + 4);
              local_448 = *(undefined8 *)((long)(&pNVar7[1].val.m_backend.data + 1) + lVar23 + 8);
              value2_01.m_backend.data._M_elems._8_7_ = in_stack_fffffffffffff6b0;
              value2_01.m_backend.data._M_elems._0_8_ = &local_478;
              value2_01.m_backend.data._M_elems[3]._3_1_ = in_stack_fffffffffffff6b7;
              value2_01.m_backend.data._M_elems._16_8_ = poVar13;
              value2_01.m_backend.data._M_elems._24_8_ = p_cnames;
              value2_01.m_backend.data._M_elems._32_8_ = pSVar28;
              value2_01.m_backend._40_8_ = pNVar29;
              value2_01.m_backend.fpclass._0_1_ = in_stack_fffffffffffff6d8;
              value2_01.m_backend._49_7_ = in_stack_fffffffffffff6d9;
              MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (poVar13,(char *)0x0,
                         (char *)CONCAT71(in_stack_fffffffffffff6d9,in_stack_fffffffffffff6d8),
                         pcVar25,&local_438,pcVar15,value2_01);
              lVar23 = lVar23 + 0x78;
              pSVar27 = pSVar28;
              pNVar30 = pNVar29;
            }
            this = pSVar27;
            p_rnames = pNVar30;
            if (local_8a4 !=
                (pIVar2->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused) {
              pcVar25 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (pSVar27,iVar11,p_cnames,name);
              pcVar15 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (pSVar27,*(int *)((long)(&((pIVar2->data).
                                                                                                                          
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar23),pNVar30,name1);
              pNVar7 = (pIVar2->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              puVar3 = (uint *)((long)(pNVar7->val).m_backend.data._M_elems + lVar23);
              local_4b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar3;
              local_4b8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
              puVar3 = (uint *)((long)(pNVar7->val).m_backend.data._M_elems + lVar23 + 0x10);
              local_4b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
              local_4b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
              local_4b8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar23 + 0x20);
              local_4b8.m_backend.exp = *(int *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar23)
              ;
              local_4b8.m_backend.neg =
                   *(bool *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar23 + 4);
              local_4b8.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar23 + 8);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (&local_110,0.0,(type *)0x0);
              value2_02.m_backend.data._M_elems._8_7_ = in_stack_fffffffffffff6b0;
              value2_02.m_backend.data._M_elems._0_8_ = &local_110;
              value2_02.m_backend.data._M_elems[3]._3_1_ = in_stack_fffffffffffff6b7;
              value2_02.m_backend.data._M_elems._16_8_ = poVar13;
              value2_02.m_backend.data._M_elems._24_8_ = p_cnames;
              value2_02.m_backend.data._M_elems._32_8_ = this;
              value2_02.m_backend._40_8_ = p_rnames;
              value2_02.m_backend.fpclass._0_1_ = in_stack_fffffffffffff6d8;
              value2_02.m_backend._49_7_ = in_stack_fffffffffffff6d9;
              MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (poVar13,(char *)0x0,pcVar25,pcVar15,&local_4b8,(char *)0x0,value2_02);
            }
            pnVar5 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_4f8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)(pnVar5[lVar20].m_backend.data._M_elems + 8);
            local_4f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[lVar20].m_backend.data;
            local_4f8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(pnVar5[lVar20].m_backend.data._M_elems + 2);
            puVar3 = pnVar5[lVar20].m_backend.data._M_elems + 4;
            local_4f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
            local_4f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
            local_4f8.m_backend.exp = pnVar5[lVar20].m_backend.exp;
            local_4f8.m_backend.neg = pnVar5[lVar20].m_backend.neg;
            local_4f8.m_backend.fpclass = pnVar5[lVar20].m_backend.fpclass;
            local_4f8.m_backend.prec_elem = pnVar5[lVar20].m_backend.prec_elem;
            pSVar27 = this;
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                       &old_verbosity,
                       &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
            eps = Tolerances::epsilon((Tolerances *)_old_verbosity);
            bVar9 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (&local_4f8,eps);
            bVar19 = bVar9 | (byte)local_8a8;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_910);
            if (bVar19 == 1) {
              pcVar25 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (this,iVar11,p_cnames,name);
              pnVar5 = (this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              result.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[lVar20].m_backend.data;
              result.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)(pnVar5[lVar20].m_backend.data._M_elems + 2);
              puVar3 = pnVar5[lVar20].m_backend.data._M_elems + 4;
              result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
              result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
              result.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)(pnVar5[lVar20].m_backend.data._M_elems + 8);
              result.m_backend.exp = pnVar5[lVar20].m_backend.exp;
              result.m_backend.neg = pnVar5[lVar20].m_backend.neg;
              result.m_backend.fpclass = pnVar5[lVar20].m_backend.fpclass;
              result.m_backend.prec_elem = pnVar5[lVar20].m_backend.prec_elem;
              if (result.m_backend.fpclass != cpp_dec_float_finite ||
                  result.m_backend.data._M_elems[0] != 0) {
                result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (&local_148,0.0,(type *)0x0);
              value2_03.m_backend.data._M_elems._8_7_ = in_stack_fffffffffffff6b0;
              value2_03.m_backend.data._M_elems._0_8_ = &local_148;
              value2_03.m_backend.data._M_elems[3]._3_1_ = in_stack_fffffffffffff6b7;
              value2_03.m_backend.data._M_elems._16_8_ = poVar13;
              value2_03.m_backend.data._M_elems._24_8_ = p_cnames;
              value2_03.m_backend.data._M_elems._32_8_ = pSVar27;
              value2_03.m_backend._40_8_ = p_rnames;
              value2_03.m_backend.fpclass._0_1_ = in_stack_fffffffffffff6d8;
              value2_03.m_backend._49_7_ = in_stack_fffffffffffff6d9;
              MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (poVar13,(char *)0x0,pcVar25,"MINIMIZE",&result,(char *)0x0,value2_03);
            }
          }
        }
        if (in_stack_fffffffffffff6b7 != 0) {
          poVar16 = std::operator<<(poVar13,"    MARK0001  \'MARKER\'                 \'INTEND\'");
          std::endl<char,std::char_traits<char>>(poVar16);
        }
      }
      poVar16 = std::operator<<(poVar13,"RHS");
      std::endl<char,std::char_traits<char>>(poVar16);
      iVar12 = 0;
      do {
        pNVar30 = p_rnames;
        do {
          if ((this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum <= iVar12) {
            if ((local_8d8 & 1) != 0) {
              poVar16 = std::operator<<(poVar13,"RANGES");
              std::endl<char,std::char_traits<char>>(poVar16);
              lVar24 = 0;
              for (lVar20 = 0;
                  lVar20 < (this->
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum; lVar20 = lVar20 + 1) {
                pnVar5 = (this->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pdVar14 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,-*pdVar14,(type *)0x0);
                tVar10 = boost::multiprecision::operator>
                                   ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)(pnVar5->m_backend).data._M_elems + lVar24),
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&old_verbosity);
                if (tVar10) {
                  pnVar5 = (this->
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).right.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pdVar14 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<50U,_int,_void> *)local_898,*pdVar14,(type *)0x0);
                  tVar10 = boost::multiprecision::operator<
                                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)(pnVar5->m_backend).data._M_elems + lVar24),
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)local_898);
                  if (tVar10) {
                    pcVar25 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (this,(int)lVar20,pNVar30,name1);
                    in_stack_fffffffffffff6d8 = SUB81(pcVar25,0);
                    in_stack_fffffffffffff6d9 = (undefined7)((ulong)pcVar25 >> 8);
                    result_1.m_backend.fpclass = cpp_dec_float_finite;
                    result_1.m_backend.prec_elem = 10;
                    result_1.m_backend.data._M_elems[0] = 0;
                    result_1.m_backend.data._M_elems[1] = 0;
                    result_1.m_backend.data._M_elems[2] = 0;
                    result_1.m_backend.data._M_elems[3] = 0;
                    result_1.m_backend.data._M_elems[4] = 0;
                    result_1.m_backend.data._M_elems[5] = 0;
                    result_1.m_backend.data._M_elems._24_5_ = 0;
                    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                    result_1.m_backend.data._M_elems._32_5_ = 0;
                    result_1.m_backend._37_8_ = 0;
                    boost::multiprecision::default_ops::
                    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (&result_1.m_backend,
                               (cpp_dec_float<50U,_int,_void> *)
                               ((long)(((this->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).right.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                      _M_elems + lVar24),
                               (cpp_dec_float<50U,_int,_void> *)
                               ((long)(((this->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).left.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                      _M_elems + lVar24));
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>(&local_1b8,0.0,(type *)0x0);
                    value2_05.m_backend.data._M_elems._8_7_ = in_stack_fffffffffffff6b0;
                    value2_05.m_backend.data._M_elems._0_8_ = &local_1b8;
                    value2_05.m_backend.data._M_elems[3]._3_1_ = in_stack_fffffffffffff6b7;
                    value2_05.m_backend.data._M_elems._16_8_ = poVar13;
                    value2_05.m_backend.data._M_elems._24_8_ = p_cnames;
                    value2_05.m_backend.data._M_elems._32_8_ = pSVar27;
                    value2_05.m_backend._40_8_ = pNVar30;
                    value2_05.m_backend.fpclass._0_1_ = in_stack_fffffffffffff6d8;
                    value2_05.m_backend._49_7_ = in_stack_fffffffffffff6d9;
                    MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (poVar13,"","RANGE",
                               (char *)CONCAT71(in_stack_fffffffffffff6d9,in_stack_fffffffffffff6d8)
                               ,&result_1,(char *)0x0,value2_05);
                  }
                }
                lVar24 = lVar24 + 0x38;
              }
            }
            poVar16 = std::operator<<(poVar13,"BOUNDS");
            std::endl<char,std::char_traits<char>>(poVar16);
            lVar24 = 0;
            lVar20 = 0;
            do {
              pcVar26 = &local_3b0;
              if ((pSVar27->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum <= lVar20) {
                poVar13 = std::operator<<(poVar13,"ENDATA");
                std::endl<char,std::char_traits<char>>(poVar13);
                if (((pSVar27->thesense == MAXIMIZE) &&
                    (pSVar8 = pSVar27->spxout, pSVar8 != (SPxOut *)0x0)) &&
                   (0 < (int)pSVar8->m_verbosity)) {
                  old_verbosity = pSVar8->m_verbosity;
                  local_898._0_4_ = 1;
                  (*pSVar8->_vptr_SPxOut[2])();
                  soplex::operator<<(pSVar27->spxout,
                                     "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n"
                                    );
                  (*pSVar27->spxout->_vptr_SPxOut[2])(pSVar27->spxout,&old_verbosity);
                }
                return;
              }
              pSVar28 = pSVar27;
              bVar9 = boost::multiprecision::operator==
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)(((pSVar27->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).low.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                           data._M_elems + lVar24),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)(((pSVar27->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                           data._M_elems + lVar24));
              iVar12 = (int)lVar20;
              if (bVar9) {
                pcVar25 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (pSVar27,iVar12,p_cnames,name1);
                pnVar5 = (pSVar27->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
                local_6f8.data._M_elems._0_8_ = *(undefined8 *)puVar3;
                local_6f8.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
                puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + 0x10);
                local_6f8.data._M_elems._16_8_ = *(undefined8 *)puVar3;
                local_6f8.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
                local_6f8.data._M_elems._32_8_ =
                     *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + 0x20);
                local_6f8.exp = *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar24);
                local_6f8.neg = *(bool *)((long)(&(pnVar5->m_backend).data + 1) + lVar24 + 4U);
                local_6f8._48_8_ =
                     *(undefined8 *)((long)(&(pnVar5->m_backend).data + 1) + lVar24 + 8U);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>(pcVar26,0.0,(type *)0x0);
                pcVar15 = "FX";
                pcVar21 = &local_6f8;
LAB_002119f9:
                value2_07.m_backend.data._M_elems._8_7_ = in_stack_fffffffffffff6b0;
                value2_07.m_backend.data._M_elems._0_8_ = pcVar26;
                value2_07.m_backend.data._M_elems[3]._3_1_ = in_stack_fffffffffffff6b7;
                value2_07.m_backend.data._M_elems._16_8_ = poVar13;
                value2_07.m_backend.data._M_elems._24_8_ = p_cnames;
                value2_07.m_backend.data._M_elems._32_8_ = pSVar28;
                value2_07.m_backend._40_8_ = pNVar30;
                value2_07.m_backend.fpclass._0_1_ = in_stack_fffffffffffff6d8;
                value2_07.m_backend._49_7_ = in_stack_fffffffffffff6d9;
                MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (poVar13,pcVar15,"BOUND",pcVar25,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar21,(char *)0x0,value2_07);
                p_lp = pSVar28;
              }
              else {
                pnVar5 = (pSVar27->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pdVar14 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,-*pdVar14,(type *)0x0);
                tVar10 = boost::multiprecision::operator<=
                                   ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)(pnVar5->m_backend).data._M_elems + lVar24),
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&old_verbosity);
                p_lp = pSVar28;
                if (tVar10) {
                  pnVar5 = (pSVar27->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).up.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pdVar14 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<50U,_int,_void> *)local_898,*pdVar14,(type *)0x0);
                  tVar10 = boost::multiprecision::operator>=
                                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)(pnVar5->m_backend).data._M_elems + lVar24),
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)local_898);
                  p_lp = pSVar28;
                  if (tVar10) {
                    pcVar25 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (pSVar27,iVar12,p_cnames,name1);
                    pcVar21 = &local_1f0;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>(pcVar21,0.0,(type *)0x0);
                    pcVar26 = &local_228;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>(pcVar26,0.0,(type *)0x0);
                    pcVar15 = "FR";
                    goto LAB_002119f9;
                  }
                }
                _old_verbosity = (pointer)0x0;
                tVar10 = boost::multiprecision::operator!=
                                   ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)(((pSVar27->
                                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                ).low.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              m_backend).data._M_elems + lVar24),
                                    (double *)&old_verbosity);
                if (tVar10) {
                  pnVar5 = (p_lp->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).low.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pSVar27 = p_lp;
                  pdVar14 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,-*pdVar14,(type *)0x0);
                  tVar10 = boost::multiprecision::operator>
                                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)(pnVar5->m_backend).data._M_elems + lVar24),
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&old_verbosity);
                  pcVar25 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (p_lp,iVar12,p_cnames,name1);
                  if (tVar10) {
                    pnVar5 = (p_lp->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).low.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    local_738.data._M_elems._32_8_ =
                         *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + 0x20);
                    puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
                    local_738.data._M_elems._0_8_ = *(undefined8 *)puVar3;
                    local_738.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
                    puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + 0x10);
                    local_738.data._M_elems._16_8_ = *(undefined8 *)puVar3;
                    local_738.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
                    local_738.exp = *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar24);
                    local_738.neg = *(bool *)((long)(&(pnVar5->m_backend).data + 1) + lVar24 + 4U);
                    local_738._48_8_ =
                         *(undefined8 *)((long)(&(pnVar5->m_backend).data + 1) + lVar24 + 8U);
                    pcVar26 = &local_260;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>(pcVar26,0.0,(type *)0x0);
                    pcVar15 = "LO";
                    pcVar21 = &local_738;
                    p_lp = pSVar27;
                  }
                  else {
                    pcVar21 = &local_298;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>(pcVar21,0.0,(type *)0x0);
                    pcVar26 = &local_2d0;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>(pcVar26,0.0,(type *)0x0);
                    pcVar15 = "MI";
                    p_lp = pSVar27;
                  }
                  value2_06.m_backend.data._M_elems._8_7_ = in_stack_fffffffffffff6b0;
                  value2_06.m_backend.data._M_elems._0_8_ = pcVar26;
                  value2_06.m_backend.data._M_elems[3]._3_1_ = in_stack_fffffffffffff6b7;
                  value2_06.m_backend.data._M_elems._16_8_ = poVar13;
                  value2_06.m_backend.data._M_elems._24_8_ = p_cnames;
                  value2_06.m_backend.data._M_elems._32_8_ = p_lp;
                  value2_06.m_backend._40_8_ = pNVar30;
                  value2_06.m_backend.fpclass._0_1_ = in_stack_fffffffffffff6d8;
                  value2_06.m_backend._49_7_ = in_stack_fffffffffffff6d9;
                  MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (poVar13,pcVar15,"BOUND",pcVar25,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar21,(char *)0x0,value2_06);
                }
                if (((byte)local_8d0 != '\0') &&
                   (iVar11 = IdxSet::pos(&p_intvars->super_IdxSet,iVar12), -1 < iVar11)) {
                  pSVar28 = p_lp;
                  pcVar25 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (p_lp,iVar12,p_cnames,name1);
                  pnVar5 = (p_lp->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).up.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
                  local_778.data._M_elems._0_8_ = *(undefined8 *)puVar3;
                  local_778.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
                  puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + 0x10);
                  local_778.data._M_elems._16_8_ = *(undefined8 *)puVar3;
                  local_778.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
                  local_778.data._M_elems._32_8_ =
                       *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + 0x20);
                  local_778.exp = *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar24);
                  local_778.neg = *(bool *)((long)(&(pnVar5->m_backend).data + 1) + lVar24 + 4U);
                  local_778._48_8_ =
                       *(undefined8 *)((long)(&(pnVar5->m_backend).data + 1) + lVar24 + 8U);
                  pcVar26 = &local_308;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>(pcVar26,0.0,(type *)0x0);
                  pcVar15 = "UP";
                  pcVar21 = &local_778;
                  goto LAB_002119f9;
                }
                pnVar5 = (p_lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pdVar14 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,*pdVar14,(type *)0x0);
                tVar10 = boost::multiprecision::operator<
                                   ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)(pnVar5->m_backend).data._M_elems + lVar24),
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&old_verbosity);
                if (tVar10) {
                  pSVar28 = p_lp;
                  pcVar25 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (p_lp,iVar12,p_cnames,name1);
                  pnVar5 = (p_lp->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).up.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
                  local_7b8.data._M_elems._0_8_ = *(undefined8 *)puVar3;
                  local_7b8.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
                  puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + 0x10);
                  local_7b8.data._M_elems._16_8_ = *(undefined8 *)puVar3;
                  local_7b8.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
                  local_7b8.data._M_elems._32_8_ =
                       *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + 0x20);
                  local_7b8.exp = *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar24);
                  local_7b8.neg = *(bool *)((long)(&(pnVar5->m_backend).data + 1) + lVar24 + 4U);
                  local_7b8._48_8_ =
                       *(undefined8 *)((long)(&(pnVar5->m_backend).data + 1) + lVar24 + 8U);
                  pcVar26 = &local_340;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>(pcVar26,0.0,(type *)0x0);
                  pcVar15 = "UP";
                  pcVar21 = &local_7b8;
                  goto LAB_002119f9;
                }
              }
              lVar20 = lVar20 + 1;
              lVar24 = lVar24 + 0x38;
              pSVar27 = p_lp;
            } while( true );
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)local_898,0.0,(type *)0x0);
          lVar20 = (long)iVar12;
          lVar24 = lVar20 * 0x38 + 0x30;
          for (; iVar11 = (this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum, lVar20 < iVar11; lVar20 = lVar20 + 1) {
            pnVar5 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_518 = *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x10);
            puVar4 = (undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x30);
            local_538 = *puVar4;
            uStack_530 = puVar4[1];
            puVar4 = (undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x20);
            local_528 = *puVar4;
            uStack_520 = puVar4[1];
            local_510 = *(undefined4 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -8);
            local_50c = *(undefined1 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -4);
            local_508 = *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
            pnVar5 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_578.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x10);
            puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x30);
            local_578.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar3;
            local_578.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
            puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x20);
            local_578.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
            local_578.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
            local_578.m_backend.exp =
                 *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -8);
            local_578.m_backend.neg =
                 *(bool *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -4);
            local_578.m_backend._48_8_ =
                 *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
            MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_860,(soplex *)&local_538,&local_578,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)CONCAT31((int3)((uint)local_578.m_backend.exp >> 8),
                                          local_578.m_backend.neg));
            local_8f8[0] = local_840[0];
            local_8f8[1] = local_840[1];
            local_908._M_allocated_capacity = local_850;
            local_908._8_4_ = auStack_848[0];
            local_908._12_4_ = auStack_848[1];
            _old_verbosity = (pointer)local_860;
            _Stack_910._M_pi = p_Stack_858;
            local_8f0 = local_838;
            local_8ec = local_834;
            local_8e8 = local_830;
            iStack_8e4 = iStack_82c;
            local_8b0 = 0.0;
            tVar10 = boost::multiprecision::operator!=
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&old_verbosity,&local_8b0);
            if (tVar10) {
              iVar11 = (this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
              break;
            }
            lVar24 = lVar24 + 0x38;
          }
          iVar12 = (int)lVar20;
        } while (iVar11 <= iVar12);
        lVar24 = lVar20 * 0x38 + 0x68;
        iVar11 = iVar12 + 2;
        do {
          iVar17 = iVar11;
          lVar20 = lVar20 + 1;
          iVar11 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
          if (iVar11 <= lVar20) goto LAB_00211201;
          pnVar5 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_598 = *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x10);
          puVar4 = (undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x30);
          local_5b8 = *puVar4;
          uStack_5b0 = puVar4[1];
          puVar4 = (undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x20);
          local_5a8 = *puVar4;
          uStack_5a0 = puVar4[1];
          local_590 = *(undefined4 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -8);
          local_58c = *(undefined1 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -4);
          local_588 = *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
          pnVar5 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_5f8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x10);
          puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x30);
          local_5f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar3;
          local_5f8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
          puVar3 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x20);
          local_5f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
          local_5f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
          local_5f8.m_backend.exp = *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -8);
          local_5f8.m_backend.neg = *(bool *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -4)
          ;
          local_5f8.m_backend._48_8_ =
               *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
          MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_860,(soplex *)&local_5b8,&local_5f8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)CONCAT31((int3)((uint)local_5f8.m_backend.exp >> 8),
                                        local_5f8.m_backend.neg));
          local_878[0] = local_840[0];
          local_878[1] = local_840[1];
          local_888 = local_850;
          auStack_880[0] = auStack_848[0];
          auStack_880[1] = auStack_848[1];
          local_898._0_8_ = local_860;
          local_898._8_8_ = p_Stack_858;
          local_870 = local_838;
          local_86c = local_834;
          local_868 = local_830;
          iStack_864 = iStack_82c;
          local_8b0 = 0.0;
          tVar10 = boost::multiprecision::operator!=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_898,&local_8b0);
          lVar24 = lVar24 + 0x38;
          iVar11 = iVar17 + 1;
        } while (!tVar10);
        iVar11 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
LAB_00211201:
        p_rnames = pNVar30;
        pcVar25 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar12,pNVar30,name1);
        if (iVar17 + -1 < iVar11) {
          local_618[0] = local_8f8[0];
          local_618[1] = local_8f8[1];
          local_628 = local_908._M_allocated_capacity;
          auStack_620[0] = local_908._8_4_;
          auStack_620[1] = local_908._12_4_;
          local_638 = (Tolerances *)_old_verbosity;
          p_Stack_630 = _Stack_910._M_pi;
          local_610 = local_8f0;
          local_60c = local_8ec;
          local_608 = local_8e8;
          iStack_604 = iStack_8e4;
          pcVar15 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,iVar17 + -1,pNVar30,name2);
          local_678 = (Tolerances *)local_898._0_8_;
          p_Stack_670 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_898._8_8_;
          local_668 = local_888;
          auStack_660[0] = auStack_880[0];
          auStack_660[1] = auStack_880[1];
          local_658[0] = local_878[0];
          local_658[1] = local_878[1];
          local_650 = local_870;
          local_64c = local_86c;
          local_648 = local_868;
          iStack_644 = iStack_864;
          pcVar26 = (cpp_dec_float<50U,_int,_void> *)&local_678;
          value1 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_638;
        }
        else {
          local_698[0] = local_8f8[0];
          local_698[1] = local_8f8[1];
          local_6a8 = local_908._M_allocated_capacity;
          auStack_6a0[0] = local_908._8_4_;
          auStack_6a0[1] = local_908._12_4_;
          local_6b8 = (Tolerances *)_old_verbosity;
          p_Stack_6b0 = _Stack_910._M_pi;
          local_690 = local_8f0;
          local_68c = local_8ec;
          local_688 = local_8e8;
          iStack_684 = iStack_8e4;
          pcVar26 = &local_180;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (pcVar26,0.0,(type *)0x0);
          value1 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_6b8;
          pcVar15 = (char *)0x0;
        }
        value2_04.m_backend.data._M_elems._8_7_ = in_stack_fffffffffffff6b0;
        value2_04.m_backend.data._M_elems._0_8_ = pcVar26;
        value2_04.m_backend.data._M_elems[3]._3_1_ = in_stack_fffffffffffff6b7;
        value2_04.m_backend.data._M_elems._16_8_ = poVar13;
        value2_04.m_backend.data._M_elems._24_8_ = p_cnames;
        value2_04.m_backend.data._M_elems._32_8_ = pSVar27;
        value2_04.m_backend._40_8_ = p_rnames;
        value2_04.m_backend.fpclass._0_1_ = in_stack_fffffffffffff6d8;
        value2_04.m_backend._49_7_ = in_stack_fffffffffffff6d9;
        MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (poVar13,(char *)0x0,"RHS",pcVar25,value1,pcVar15,value2_04);
        iVar12 = iVar17;
      } while( true );
    }
    bVar9 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)(((this->
                                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).left.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                 _M_elems + lVar24),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)(((this->
                                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).right.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                 _M_elems + lVar24));
    pNVar30 = p_rnames;
    if (bVar9) {
      pcVar25 = "E";
    }
    else {
      pnVar5 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_8d8 = uVar18;
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,-*pdVar14,(type *)0x0);
      tVar10 = boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)(pnVar5->m_backend).data._M_elems + lVar24),
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&old_verbosity);
      if (tVar10) {
        pnVar5 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar14 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)local_898,*pdVar14,(type *)0x0);
        tVar10 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)(pnVar5->m_backend).data._M_elems + lVar24),
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_898);
        pcVar25 = "E";
        uVar18 = 1;
        if (tVar10) goto LAB_00210929;
      }
      pnVar5 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,-*pdVar14,(type *)0x0);
      tVar10 = boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)(pnVar5->m_backend).data._M_elems + lVar24),
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&old_verbosity);
      if (tVar10) {
        pcVar25 = "G";
        uVar18 = local_8d8 & 0xffffffff;
      }
      else {
        pnVar5 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar14 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,*pdVar14,(type *)0x0);
        tVar10 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)(pnVar5->m_backend).data._M_elems + lVar24),
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&old_verbosity);
        pcVar25 = "L";
        uVar18 = local_8d8;
        if (!tVar10) {
          this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&old_verbosity,"XMPSWR02 This should never happen.",
                     (allocator *)local_898);
          SPxInternalCodeException::SPxInternalCodeException(this_00,(string *)&old_verbosity);
          __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
      }
    }
LAB_00210929:
    in_stack_fffffffffffff6d8 = (undefined1)uVar18;
    pcVar15 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (this,(int)lVar20,p_rnames,name);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_378,0.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_68,0.0,(type *)0x0);
    value2.m_backend.data._M_elems._8_7_ = in_stack_fffffffffffff6b0;
    value2.m_backend.data._M_elems._0_8_ = &local_68;
    value2.m_backend.data._M_elems[3]._3_1_ = in_stack_fffffffffffff6b7;
    value2.m_backend.data._M_elems._16_8_ = p_output;
    value2.m_backend.data._M_elems._24_8_ = p_cnames;
    value2.m_backend.data._M_elems[8] = (int)in_stack_fffffffffffff6c8;
    value2.m_backend.data._M_elems[9] = (int)((ulong)in_stack_fffffffffffff6c8 >> 0x20);
    value2.m_backend._40_8_ = pNVar30;
    value2.m_backend.fpclass._0_1_ = in_stack_fffffffffffff6d8;
    value2.m_backend._49_7_ = in_stack_fffffffffffff6d9;
    MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (p_output,pcVar25,pcVar15,(char *)0x0,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_378,(char *)0x0,value2);
    lVar20 = lVar20 + 1;
    lVar24 = lVar24 + 0x38;
    uVar18 = CONCAT71((int7)((ulong)extraout_RAX >> 8),in_stack_fffffffffffff6d8) & 0xffffffff;
    p_rnames = pNVar30;
  } while( true );
}

Assistant:

inline
void SPxLPBase<R>::writeMPS(
   std::ostream&  p_output,          ///< output stream.
   const NameSet* p_rnames,          ///< row names.
   const NameSet* p_cnames,          ///< column names.
   const DIdxSet* p_intvars,         ///< integer variables.
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{

   const char*    indicator;
   char           name [16];
   char           name1[16];
   char           name2[16];
   bool           has_ranges = false;
   int            i;
   int            k;

   SPxOut::setScientific(p_output, 16);
   // --- NAME Section ---
   p_output << "NAME          MPSDATA" << std::endl;

   // --- ROWS Section ---
   p_output << "ROWS" << std::endl;

   for(i = 0; i < nRows(); i++)
   {
      if(lhs(i) == rhs(i))
         indicator = "E";
      else if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
      {
         indicator = "E";
         has_ranges = true;
      }
      else if(lhs(i) > R(-infinity))
         indicator = "G";
      else if(rhs(i) <  R(infinity))
         indicator = "L";
      else
         throw SPxInternalCodeException("XMPSWR02 This should never happen.");

      MPSwriteRecord<R>(p_output, indicator, MPSgetRowName(*this, i, p_rnames, name));
   }

   MPSwriteRecord<R>(p_output, "N", "MINIMIZE");

   // --- COLUMNS Section ---
   p_output << "COLUMNS" << std::endl;

   bool has_intvars = (p_intvars != nullptr) && (p_intvars->size() > 0);

   for(int j = 0; j < (has_intvars ? 2 : 1); j++)
   {
      bool is_intrun = has_intvars && (j == 1);

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTORG'" << std::endl;

      for(i = 0; i < nCols(); i++)
      {
         bool is_intvar = has_intvars && (p_intvars->pos(i) >= 0);

         if((is_intrun && !is_intvar) || (!is_intrun &&  is_intvar))
            continue;

         const SVectorBase<R>& col = colVector(i);
         int colsize2 = (col.size() / 2) * 2;

         assert(colsize2 % 2 == 0);

         for(k = 0; k < colsize2; k += 2)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k),
                           MPSgetRowName(*this, col.index(k + 1), p_rnames, name2), col.value(k + 1));

         if(colsize2 != col.size())
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k));

         if(isNotZero(maxObj(i), this->tolerances()->epsilon()) || writeZeroObjective)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name), "MINIMIZE", -maxObj(i));
      }

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTEND'" << std::endl;
   }

   // --- RHS Section ---
   p_output << "RHS" << std::endl;

   i = 0;

   while(i < nRows())
   {
      R rhsval1 = 0.0;
      R rhsval2 = 0.0;

      for(; i < nRows(); i++)
         if((rhsval1 = MPSgetRHS(lhs(i), rhs(i))) != 0.0)
            break;

      if(i < nRows())
      {
         for(k = i + 1; k < nRows(); k++)
         {
            if((rhsval2 = MPSgetRHS(lhs(k), rhs(k))) != 0.0)
               break;
         }

         if(k < nRows())
         {
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1,
                           MPSgetRowName(*this, k, p_rnames, name2), rhsval2);
         }
         else
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1);

         i = k + 1;
      }
   }

   // --- RANGES Section ---
   if(has_ranges)
   {
      p_output << "RANGES" << std::endl;

      for(i = 0; i < nRows(); i++)
      {
         if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
            MPSwriteRecord(p_output, "", "RANGE", MPSgetRowName(*this, i, p_rnames, name1), rhs(i) - lhs(i));
      }
   }

   // --- BOUNDS Section ---
   p_output << "BOUNDS" << std::endl;

   for(i = 0; i < nCols(); i++)
   {
      if(lower(i) == upper(i))
      {
         MPSwriteRecord(p_output, "FX", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         continue;
      }

      if((lower(i) <= R(-infinity)) && (upper(i) >= R(infinity)))
      {
         MPSwriteRecord<R>(p_output, "FR", "BOUND", getColName(*this, i, p_cnames, name1));
         continue;
      }

      if(lower(i) != 0.0)
      {
         if(lower(i) > R(-infinity))
            MPSwriteRecord(p_output, "LO", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         else
            MPSwriteRecord<R>(p_output, "MI", "BOUND", getColName(*this, i, p_cnames, name1));
      }

      if(has_intvars && (p_intvars->pos(i) >= 0))
      {
         // Integer variables have default upper bound 1.0, but we should write
         // it nevertheless since CPLEX seems to assume R(infinity) otherwise.
         MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
      else
      {
         // Continous variables have default upper bound R(infinity)
         if(upper(i) < R(infinity))
            MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
   }

   // --- ENDATA Section ---
   p_output << "ENDATA" << std::endl;

   // Output warning when writing a maximisation problem
   if(spxSense() == SPxLPBase<R>::MAXIMIZE)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n");
   }
}